

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<unsigned_long,_false,_long>::BitpackingWriter::WriteConstant
               (unsigned_long constant,idx_t count,void *data_ptr,bool all_invalid)

{
  atomic<unsigned_long> *paVar1;
  unsigned_long *puVar2;
  pointer pCVar3;
  
  ReserveSpace((BitpackingCompressionState<unsigned_long,_false,_long> *)data_ptr,8);
  WriteMetaData((BitpackingCompressionState<unsigned_long,_false,_long> *)data_ptr,CONSTANT);
  puVar2 = *(unsigned_long **)((long)data_ptr + 0x40);
  *puVar2 = constant;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar2 + 1;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)((long)data_ptr + 0x20));
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  return;
}

Assistant:

static void WriteConstant(T constant, idx_t count, void *data_ptr, bool all_invalid) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}